

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go.h
# Opt level: O1

void __thiscall GoState<3U,_4U>::check_alive(GoState<3U,_4U> *this,int i,int j)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  _Rb_tree_node_base *p_Var3;
  undefined4 in_register_00000014;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  pieces;
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  local_40;
  
  p_Var1 = &local_40._M_impl.super__Rb_tree_header;
  local_40._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_40._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_40._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_40._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_40._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  iVar2 = (*this->_vptr_GoState[9])(this,i,CONCAT44(in_register_00000014,j),&local_40);
  p_Var3 = local_40._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((char)iVar2 == '\0') {
    for (; (_Rb_tree_header *)p_Var3 != p_Var1;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      this->board[(int)p_Var3[1]._M_color][*(int *)&p_Var3[1].field_0x4] = '\0';
    }
  }
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  ::~_Rb_tree(&local_40);
  return;
}

Assistant:

virtual void check_alive(int i, int j)
	{
		std::set<std::pair<int, int>> pieces;
		if (!is_alive(i, j, &pieces)) {
			// Remove the dead pieces.
			for (auto& ij: pieces) {
				int i, j;
				std::tie(i, j) = ij;
				board[i][j] = empty;
			}
		}
	}